

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_duration * mg_duration_make(int64_t months,int64_t days,int64_t seconds,int64_t nanoseconds)

{
  mg_allocator *in_RCX;
  int64_t in_RDX;
  int64_t in_RSI;
  int64_t in_RDI;
  mg_duration *dur;
  mg_duration *local_8;
  
  local_8 = mg_duration_alloc(in_RCX);
  if (local_8 == (mg_duration *)0x0) {
    local_8 = (mg_duration *)0x0;
  }
  else {
    local_8->months = in_RDI;
    local_8->days = in_RSI;
    local_8->seconds = in_RDX;
    local_8->nanoseconds = (int64_t)in_RCX;
  }
  return local_8;
}

Assistant:

mg_duration *mg_duration_make(int64_t months, int64_t days, int64_t seconds,
                              int64_t nanoseconds) {
  mg_duration *dur = mg_duration_alloc(&mg_system_allocator);
  if (!dur) {
    return NULL;
  }
  dur->months = months;
  dur->days = days;
  dur->seconds = seconds;
  dur->nanoseconds = nanoseconds;
  return dur;
}